

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

void vdbeChangeP4Full(Vdbe *p,Op *pOp,char *zP4,int n)

{
  size_t sVar1;
  char *pcVar2;
  
  if (pOp->p4type != '\0') {
    pOp->p4type = '\0';
    (pOp->p4).p = (void *)0x0;
  }
  if (-1 < n) {
    if (n == 0) {
      if (zP4 == (char *)0x0) {
        n = 0;
      }
      else {
        sVar1 = strlen(zP4);
        n = (uint)sVar1 & 0x3fffffff;
      }
    }
    pcVar2 = sqlite3DbStrNDup(p->db,zP4,(ulong)(uint)n);
    (pOp->p4).z = pcVar2;
    pOp->p4type = -6;
    return;
  }
  sqlite3VdbeChangeP4(p,(int)((ulong)((long)pOp - (long)p->aOp) >> 3) * -0x55555555,zP4,n);
  return;
}

Assistant:

static void SQLITE_NOINLINE vdbeChangeP4Full(
  Vdbe *p,
  Op *pOp,
  const char *zP4,
  int n
){
  if( pOp->p4type ){
    assert( pOp->p4type > P4_FREE_IF_LE );
    pOp->p4type = 0;
    pOp->p4.p = 0;
  }
  if( n<0 ){
    sqlite3VdbeChangeP4(p, (int)(pOp - p->aOp), zP4, n);
  }else{
    if( n==0 ) n = sqlite3Strlen30(zP4);
    pOp->p4.z = sqlite3DbStrNDup(p->db, zP4, n);
    pOp->p4type = P4_DYNAMIC;
  }
}